

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_util.cpp
# Opt level: O2

void duckdb::ExtensionUtil::RegisterFunction(DatabaseInstance *db,ScalarFunction *function)

{
  ScalarFunctionSet set;
  string local_1d0;
  FunctionSet<duckdb::ScalarFunction> local_1b0;
  FunctionSet<duckdb::ScalarFunction> local_178;
  ScalarFunction local_140;
  
  ::std::__cxx11::string::string
            ((string *)&local_1d0,
             (string *)
             &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name);
  ScalarFunctionSet::ScalarFunctionSet((ScalarFunctionSet *)&local_1b0,&local_1d0);
  ::std::__cxx11::string::~string((string *)&local_1d0);
  ScalarFunction::ScalarFunction(&local_140,function);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&local_1b0.functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_140);
  ScalarFunction::~ScalarFunction(&local_140);
  FunctionSet<duckdb::ScalarFunction>::FunctionSet(&local_178,&local_1b0);
  RegisterFunction(db,(ScalarFunctionSet *)&local_178);
  FunctionSet<duckdb::ScalarFunction>::~FunctionSet(&local_178);
  FunctionSet<duckdb::ScalarFunction>::~FunctionSet(&local_1b0);
  return;
}

Assistant:

void ExtensionUtil::RegisterFunction(DatabaseInstance &db, ScalarFunction function) {
	ScalarFunctionSet set(function.name);
	set.AddFunction(std::move(function));
	RegisterFunction(db, std::move(set));
}